

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int ixxx::posix::ftruncate(int __fd,__off_t __length)

{
  int iVar1;
  ftruncate_error *this;
  int *piVar2;
  int r;
  off_t length_local;
  int fd_local;
  
  iVar1 = ::ftruncate(__fd,__length);
  if (iVar1 == -1) {
    this = (ftruncate_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    ftruncate_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
    __cxa_throw(this,&ftruncate_error::typeinfo,ftruncate_error::~ftruncate_error);
  }
  return iVar1;
}

Assistant:

void ftruncate(int fd, off_t length)
    {
      int r = ::ftruncate(fd, length);
      if (r == -1)
        throw ftruncate_error(errno);
    }